

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream_LstFuncs.h
# Opt level: O2

UINT8 ADrvLst_Clear(ADRV_LIST **headPtr)

{
  ADRV_LIST *pAVar1;
  ADRV_LIST **extraout_RAX;
  ADRV_LIST *__ptr;
  
  __ptr = *headPtr;
  *headPtr = (ADRV_LIST *)0x0;
  while (__ptr != (ADRV_LIST *)0x0) {
    pAVar1 = __ptr->next;
    free(__ptr);
    headPtr = extraout_RAX;
    __ptr = pAVar1;
  }
  return (UINT8)headPtr;
}

Assistant:

static UINT8 ADrvLst_Clear(ADRV_LIST** headPtr)
{
	ADRV_LIST* curLstItem;
	ADRV_LIST* lastLstItm;
	
	curLstItem = *headPtr;
	*headPtr = NULL;
	while(curLstItem != NULL)
	{
		lastLstItm = curLstItem;
		curLstItem = curLstItem->next;
		free(lastLstItm);
	}
	return 0x00;
}